

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnode.c
# Opt level: O2

int lnode_create_arg_table(lua_State *L,char **argv,int argc,int script)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (script == argc) {
    script = 0;
  }
  lua_createtable(L,argc - (script + 1),script + 1);
  uVar1 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    lua_pushstring(L,argv[uVar2]);
    lua_rawseti(L,-2,uVar2 - (long)script);
  }
  lua_setglobal(L,"arg");
  return 0;
}

Assistant:

LUALIB_API int lnode_create_arg_table(lua_State *L, char **argv, int argc, int script)
{
    int i, narg;

    if (script == argc) {
        script = 0; /* no script name? */
    }

    narg = argc - (script + 1); /* number of positive indices */

    lua_createtable(L, narg, script + 1);
    for (i = 0; i < argc; i++) {
        lua_pushstring(L, argv[i]);
        lua_rawseti(L, -2, i - script);
    }
    lua_setglobal(L, "arg");

    return 0;
}